

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void pushclosure(lua_State *L,Proto *p,UpVal **encup,StkId base,StkId ra)

{
  int n;
  Upvaldesc *pUVar1;
  LClosure *pLVar2;
  UpVal *pUVar3;
  LClosure *x_;
  TValue *io;
  LClosure *ncl;
  int i;
  Upvaldesc *uv;
  int nup;
  StkId ra_local;
  StkId base_local;
  UpVal **encup_local;
  Proto *p_local;
  lua_State *L_local;
  
  n = p->sizeupvalues;
  pUVar1 = p->upvalues;
  pLVar2 = luaF_newLclosure(L,n);
  pLVar2->p = p;
  if (9 < (pLVar2->tt & 0xf)) {
    __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x3da,"void pushclosure(lua_State *, Proto *, UpVal **, StkId, StkId)");
  }
  (ra->value_).f = (lua_CFunction)pLVar2;
  ra->tt_ = 0x8006;
  if ((ra->tt_ & 0x8000) != 0) {
    if ((ra->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x3da,"void pushclosure(lua_State *, Proto *, UpVal **, StkId, StkId)");
    }
    if ((ra->tt_ & 0x7f) != (ushort)((ra->value_).gc)->tt) {
LAB_0015beda:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x3da,"void pushclosure(lua_State *, Proto *, UpVal **, StkId, StkId)");
    }
    if (L != (lua_State *)0x0) {
      if ((ra->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x3da,"void pushclosure(lua_State *, Proto *, UpVal **, StkId, StkId)");
      }
      if ((((ra->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0015beda;
    }
  }
  for (ncl._4_4_ = 0; ncl._4_4_ < n; ncl._4_4_ = ncl._4_4_ + 1) {
    if (pUVar1[ncl._4_4_].instack == '\0') {
      pLVar2->upvals[ncl._4_4_] = encup[pUVar1[ncl._4_4_].idx];
    }
    else {
      pUVar3 = luaF_findupval(L,base + (int)(uint)pUVar1[ncl._4_4_].idx);
      pLVar2->upvals[ncl._4_4_] = pUVar3;
    }
    pLVar2->upvals[ncl._4_4_]->refcount = pLVar2->upvals[ncl._4_4_]->refcount + 1;
  }
  if ((p->marked & 0x20) == 0) {
    p->cache = pLVar2;
  }
  return;
}

Assistant:

static void pushclosure (lua_State *L, Proto *p, UpVal **encup, StkId base,
                         StkId ra) {
  int nup = p->sizeupvalues;
  Upvaldesc *uv = p->upvalues;
  int i;
  LClosure *ncl = luaF_newLclosure(L, nup);
  ncl->p = p;
  setclLvalue(L, ra, ncl);  /* anchor new closure in stack */
  for (i = 0; i < nup; i++) {  /* fill in its upvalues */
    if (uv[i].instack)  /* upvalue refers to local variable? */
      ncl->upvals[i] = luaF_findupval(L, base + uv[i].idx);
    else  /* get upvalue from enclosing function */
      ncl->upvals[i] = encup[uv[i].idx];
    ncl->upvals[i]->refcount++;
    /* new closure is white, so we do not need a barrier here */
  }
  if (!isblack(p))  /* cache will not break GC invariant? */
    p->cache = ncl;  /* save it on cache for reuse */
}